

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<float,long>
               (size_t col_num,size_t nrows,float *Xc,long *Xc_ind,long *Xc_indptr,
               MissingAction missing_action,double *xmin,double *xmax,bool *unsplittable)

{
  long lVar1;
  bool bVar2;
  long ix;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar3 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  if ((ulong)(lVar1 - lVar3) < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
    dVar4 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar6 = INFINITY;
    dVar4 = -INFINITY;
  }
  if (missing_action == Fail) {
    dVar5 = dVar4;
    dVar7 = dVar6;
    if (lVar3 < lVar1) {
      do {
        dVar4 = (double)Xc[lVar3];
        dVar6 = dVar4;
        if (dVar7 <= dVar4) {
          dVar6 = dVar7;
        }
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
        lVar3 = lVar3 + 1;
        dVar5 = dVar4;
        dVar7 = dVar6;
      } while (lVar1 != lVar3);
      *xmin = dVar6;
      *xmax = dVar4;
    }
  }
  else if (lVar3 < lVar1) {
    do {
      if (ABS(Xc[lVar3]) != INFINITY) {
        dVar7 = (double)Xc[lVar3];
        dVar5 = dVar7;
        if (dVar6 <= dVar7) {
          dVar5 = dVar6;
        }
        dVar6 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar5 | -(ulong)NAN(dVar6) & (ulong)dVar7);
        *xmin = dVar6;
        dVar5 = dVar7;
        if (dVar7 <= dVar4) {
          dVar5 = dVar4;
        }
        dVar4 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar5 | -(ulong)NAN(dVar4) & (ulong)dVar7);
        *xmax = dVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  bVar2 = true;
  if (((dVar6 != dVar4) || (NAN(dVar6) || NAN(dVar4))) && (dVar4 != -INFINITY || dVar6 != INFINITY))
  {
    bVar2 = NAN(dVar4);
  }
  *unsplittable = bVar2;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}